

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_integer_points_kd_tree_decoder.h
# Opt level: O2

bool __thiscall
draco::DynamicIntegerPointsKdTreeDecoder<3>::
DecodeInternal<draco::PointAttributeVectorOutputIterator<unsigned_int>>
          (DynamicIntegerPointsKdTreeDecoder<3> *this,uint32_t num_points,
          PointAttributeVectorOutputIterator<unsigned_int> *oit)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__x;
  int *piVar1;
  pointer pvVar2;
  pointer puVar3;
  _Elt_pointer pDVar4;
  pointer puVar5;
  ulong uVar6;
  uint32_t i;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  pointer pvVar10;
  int iVar11;
  uint32_t j;
  uint uVar12;
  uint32_t uVar13;
  uint32_t uVar14;
  uint uVar15;
  uint32_t uVar16;
  bool bVar17;
  DecodingStatus local_100;
  uint32_t number;
  long local_f0;
  ulong local_e8;
  ulong local_e0;
  uint32_t local_d8;
  uint32_t local_d4;
  long local_d0;
  _Elt_pointer local_c8;
  ulong local_c0;
  DirectBitDecoder *local_b8;
  RAnsBitDecoder *local_b0;
  VectorUint32 *local_a8;
  _Elt_pointer local_a0;
  DirectBitDecoder *local_98;
  DecodingStatus init_status;
  stack<draco::DynamicIntegerPointsKdTreeDecoder<3>::DecodingStatus,_std::deque<draco::DynamicIntegerPointsKdTreeDecoder<3>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<3>::DecodingStatus>_>_>
  status_stack;
  
  init_status.num_remaining_points = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&status_stack,
             (ulong)this->dimension_,&init_status.num_remaining_points,(allocator_type *)&local_100)
  ;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
            ((this->base_stack_).
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,&status_stack);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&status_stack);
  init_status.num_remaining_points = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&status_stack,
             (ulong)this->dimension_,&init_status.num_remaining_points,(allocator_type *)&local_100)
  ;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
            ((this->levels_stack_).
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,&status_stack);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&status_stack);
  init_status.last_axis = 0;
  init_status.stack_pos = 0;
  local_d4 = num_points;
  init_status.num_remaining_points = num_points;
  std::
  stack<draco::DynamicIntegerPointsKdTreeDecoder<3>::DecodingStatus,std::deque<draco::DynamicIntegerPointsKdTreeDecoder<3>::DecodingStatus,std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<3>::DecodingStatus>>>
  ::
  stack<std::deque<draco::DynamicIntegerPointsKdTreeDecoder<3>::DecodingStatus,std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<3>::DecodingStatus>>,void>
            (&status_stack);
  std::
  deque<draco::DynamicIntegerPointsKdTreeDecoder<3>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<3>::DecodingStatus>_>
  ::push_back(&status_stack.c,&init_status);
  local_b0 = &this->numbers_decoder_;
  local_b8 = &this->half_decoder_;
  local_a8 = &this->p_;
  local_98 = &this->remaining_bits_decoder_;
  while( true ) {
    local_a0 = status_stack.c.
               super__Deque_base<draco::DynamicIntegerPointsKdTreeDecoder<3>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<3>::DecodingStatus>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur;
    local_c8 = status_stack.c.
               super__Deque_base<draco::DynamicIntegerPointsKdTreeDecoder<3>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<3>::DecodingStatus>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (status_stack.c.
        super__Deque_base<draco::DynamicIntegerPointsKdTreeDecoder<3>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<3>::DecodingStatus>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        status_stack.c.
        super__Deque_base<draco::DynamicIntegerPointsKdTreeDecoder<3>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<3>::DecodingStatus>_>
        ._M_impl.super__Deque_impl_data._M_start._M_cur) break;
    pDVar4 = status_stack.c.
             super__Deque_base<draco::DynamicIntegerPointsKdTreeDecoder<3>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<3>::DecodingStatus>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (status_stack.c.
        super__Deque_base<draco::DynamicIntegerPointsKdTreeDecoder<3>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<3>::DecodingStatus>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        status_stack.c.
        super__Deque_base<draco::DynamicIntegerPointsKdTreeDecoder<3>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<3>::DecodingStatus>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      pDVar4 = status_stack.c.
               super__Deque_base<draco::DynamicIntegerPointsKdTreeDecoder<3>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<3>::DecodingStatus>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x2a;
    }
    uVar15 = pDVar4[-1].num_remaining_points;
    uVar13 = pDVar4[-1].last_axis;
    uVar9 = pDVar4[-1].stack_pos;
    uVar7 = (ulong)uVar9;
    std::
    deque<draco::DynamicIntegerPointsKdTreeDecoder<3>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<3>::DecodingStatus>_>
    ::pop_back(&status_stack.c);
    if (local_d4 < uVar15) break;
    uVar8 = (ulong)(uVar13 + 1);
    if (this->dimension_ - 1 == uVar13) {
      uVar8 = 0;
    }
    uVar12 = (uint)uVar8;
    if (this->dimension_ <= uVar12) break;
    pvVar2 = (this->base_stack_).
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    __x = pvVar2 + uVar7;
    pvVar10 = (this->levels_stack_).
              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + uVar7;
    uVar13 = *(uint32_t *)
              (*(long *)&(pvVar10->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                         _M_impl.super__Vector_impl_data + uVar8 * 4);
    local_e8 = uVar7;
    if (this->bit_length_ == uVar13) {
      while (bVar17 = uVar15 != 0, uVar15 = uVar15 - 1, bVar17) {
        PointAttributeVectorOutputIterator<unsigned_int>::operator=(oit,__x);
        (oit->point_id_).value_ = (oit->point_id_).value_ + 1;
        this->num_decoded_points_ = this->num_decoded_points_ + 1;
      }
    }
    else if (uVar15 < 3) {
      puVar5 = (this->axes_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
               .super__Vector_impl_data._M_start;
      *puVar5 = uVar12;
      for (uVar7 = 1; uVar7 < this->dimension_; uVar7 = uVar7 + 1) {
        uVar9 = (int)uVar8 + 1;
        if ((int)uVar8 == this->dimension_ - 1) {
          uVar9 = 0;
        }
        puVar5[uVar7] = uVar9;
        uVar8 = (ulong)uVar9;
      }
      uVar9 = 0;
      while (uVar9 != uVar15) {
        local_e8 = CONCAT44(local_e8._4_4_,uVar9);
        for (uVar7 = 0; uVar7 < this->dimension_; uVar7 = uVar7 + 1) {
          puVar5 = (this->p_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          puVar3 = (this->axes_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          puVar5[puVar3[uVar7]] = 0;
          uVar8 = (ulong)puVar3[uVar7];
          iVar11 = this->bit_length_ -
                   *(int *)(*(long *)&(pvVar10->
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      )._M_impl.super__Vector_impl_data + uVar8 * 4);
          if (iVar11 != 0) {
            bVar17 = DirectBitDecoder::DecodeLeastSignificantBits32(local_98,iVar11,puVar5 + uVar8);
            if (!bVar17) goto LAB_0013c121;
            puVar5 = (this->p_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            uVar8 = (ulong)(this->axes_).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar7];
          }
          puVar5[uVar8] =
               puVar5[uVar8] |
               (__x->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start[uVar8];
        }
        PointAttributeVectorOutputIterator<unsigned_int>::operator=(oit,local_a8);
        (oit->point_id_).value_ = (oit->point_id_).value_ + 1;
        this->num_decoded_points_ = this->num_decoded_points_ + 1;
        uVar9 = (int)local_e8 + 1;
      }
    }
    else {
      if (this->num_points_ < this->num_decoded_points_) break;
      local_f0 = CONCAT44(local_f0._4_4_,this->bit_length_);
      uVar6 = (ulong)(uVar9 + 1);
      local_e0 = uVar8;
      local_d8 = uVar13;
      local_d0 = uVar7 * 0x18;
      local_c0 = uVar6;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(pvVar2 + uVar6,__x);
      piVar1 = (int *)(*(long *)&(this->base_stack_).
                                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[uVar6].
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data + local_e0 * 4);
      *piVar1 = *piVar1 + (1 << ((char)local_f0 + ~(byte)local_d8 & 0x1f));
      iVar11 = 0x1f;
      if (uVar15 != 0) {
        for (; uVar15 >> iVar11 == 0; iVar11 = iVar11 + -1) {
        }
      }
      number = 0;
      local_f0 = uVar6 * 0x18;
      RAnsBitDecoder::DecodeLeastSignificantBits32(local_b0,iVar11,&number);
      uVar13 = (uVar15 >> 1) - number;
      if (uVar15 >> 1 < number) break;
      uVar16 = uVar15 - uVar13;
      uVar14 = uVar13;
      if ((uVar13 != uVar16) &&
         (bVar17 = DirectBitDecoder::DecodeNextBit(local_b8), uVar14 = uVar16, bVar17)) {
        uVar14 = uVar13;
        uVar13 = uVar16;
      }
      pvVar2 = (this->levels_stack_).
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      piVar1 = (int *)(*(long *)((long)&(pvVar2->
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        )._M_impl.super__Vector_impl_data + local_d0) + local_e0 * 4
                      );
      *piVar1 = *piVar1 + 1;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 ((long)&(pvVar2->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                         _M_impl.super__Vector_impl_data + local_f0),
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 ((long)&(pvVar2->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                         _M_impl.super__Vector_impl_data + local_d0));
      if (uVar14 != 0) {
        local_100.stack_pos = (uint32_t)local_e8;
        local_100.num_remaining_points = uVar14;
        local_100.last_axis = uVar12;
        std::
        deque<draco::DynamicIntegerPointsKdTreeDecoder<3>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<3>::DecodingStatus>_>
        ::emplace_back<draco::DynamicIntegerPointsKdTreeDecoder<3>::DecodingStatus>
                  (&status_stack.c,&local_100);
      }
      if (uVar13 != 0) {
        local_100.stack_pos = (uint32_t)local_c0;
        local_100.num_remaining_points = uVar13;
        local_100.last_axis = uVar12;
        std::
        deque<draco::DynamicIntegerPointsKdTreeDecoder<3>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<3>::DecodingStatus>_>
        ::emplace_back<draco::DynamicIntegerPointsKdTreeDecoder<3>::DecodingStatus>
                  (&status_stack.c,&local_100);
      }
    }
  }
LAB_0013c121:
  bVar17 = local_c8 == local_a0;
  std::
  _Deque_base<draco::DynamicIntegerPointsKdTreeDecoder<3>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<3>::DecodingStatus>_>
  ::~_Deque_base((_Deque_base<draco::DynamicIntegerPointsKdTreeDecoder<3>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<3>::DecodingStatus>_>
                  *)&status_stack);
  return bVar17;
}

Assistant:

bool DynamicIntegerPointsKdTreeDecoder<compression_level_t>::DecodeInternal(
    uint32_t num_points, OutputIteratorT &oit) {
  typedef DecodingStatus Status;
  base_stack_[0] = VectorUint32(dimension_, 0);
  levels_stack_[0] = VectorUint32(dimension_, 0);
  DecodingStatus init_status(num_points, 0, 0);
  std::stack<Status> status_stack;
  status_stack.push(init_status);

  // TODO(b/199760123): Use preallocated vector instead of stack.
  while (!status_stack.empty()) {
    const DecodingStatus status = status_stack.top();
    status_stack.pop();

    const uint32_t num_remaining_points = status.num_remaining_points;
    const uint32_t last_axis = status.last_axis;
    const uint32_t stack_pos = status.stack_pos;
    const VectorUint32 &old_base = base_stack_[stack_pos];
    const VectorUint32 &levels = levels_stack_[stack_pos];

    if (num_remaining_points > num_points) {
      return false;
    }

    const uint32_t axis = GetAxis(num_remaining_points, levels, last_axis);
    if (axis >= dimension_) {
      return false;
    }

    const uint32_t level = levels[axis];

    // All axes have been fully subdivided, just output points.
    if ((bit_length_ - level) == 0) {
      for (uint32_t i = 0; i < num_remaining_points; i++) {
        *oit = old_base;
        ++oit;
        ++num_decoded_points_;
      }
      continue;
    }

    DRACO_DCHECK_EQ(true, num_remaining_points != 0);

    // Fast decoding of remaining bits if number of points is 1 or 2.
    if (num_remaining_points <= 2) {
      // TODO(b/199760123): |axes_| not necessary, remove would change
      // bitstream!
      axes_[0] = axis;
      for (uint32_t i = 1; i < dimension_; i++) {
        axes_[i] = DRACO_INCREMENT_MOD(axes_[i - 1], dimension_);
      }
      for (uint32_t i = 0; i < num_remaining_points; ++i) {
        for (uint32_t j = 0; j < dimension_; j++) {
          p_[axes_[j]] = 0;
          const uint32_t num_remaining_bits = bit_length_ - levels[axes_[j]];
          if (num_remaining_bits) {
            if (!remaining_bits_decoder_.DecodeLeastSignificantBits32(
                    num_remaining_bits, &p_[axes_[j]])) {
              return false;
            }
          }
          p_[axes_[j]] = old_base[axes_[j]] | p_[axes_[j]];
        }
        *oit = p_;
        ++oit;
        ++num_decoded_points_;
      }
      continue;
    }

    if (num_decoded_points_ > num_points_) {
      return false;
    }

    const int num_remaining_bits = bit_length_ - level;
    const uint32_t modifier = 1 << (num_remaining_bits - 1);
    base_stack_[stack_pos + 1] = old_base;         // copy
    base_stack_[stack_pos + 1][axis] += modifier;  // new base

    const int incoming_bits = MostSignificantBit(num_remaining_points);

    uint32_t number = 0;
    DecodeNumber(incoming_bits, &number);

    uint32_t first_half = num_remaining_points / 2;
    if (first_half < number) {
      // Invalid |number|.
      return false;
    }
    first_half -= number;
    uint32_t second_half = num_remaining_points - first_half;

    if (first_half != second_half) {
      if (!half_decoder_.DecodeNextBit()) {
        std::swap(first_half, second_half);
      }
    }

    levels_stack_[stack_pos][axis] += 1;
    levels_stack_[stack_pos + 1] = levels_stack_[stack_pos];  // copy
    if (first_half) {
      status_stack.push(DecodingStatus(first_half, axis, stack_pos));
    }
    if (second_half) {
      status_stack.push(DecodingStatus(second_half, axis, stack_pos + 1));
    }
  }
  return true;
}